

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O0

void sub0_ctx_close(void *arg)

{
  long lVar1;
  nni_aio *aio_00;
  nni_aio *aio;
  sub0_sock *sock;
  sub0_ctx *ctx;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 0x10);
  nni_mtx_lock((nni_mtx *)(lVar1 + 0xd8));
  while( true ) {
    aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x30));
    if (aio_00 == (nni_aio *)0x0) break;
    nni_list_remove((nni_list *)((long)arg + 0x30),aio_00);
    nni_aio_finish_error(aio_00,NNG_ECLOSED);
  }
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0xd8));
  return;
}

Assistant:

static void
sub0_ctx_close(void *arg)
{
	sub0_ctx  *ctx  = arg;
	sub0_sock *sock = ctx->sock;
	nni_aio   *aio;

	nni_mtx_lock(&sock->lk);
	while ((aio = nni_list_first(&ctx->recv_queue)) != NULL) {
		nni_list_remove(&ctx->recv_queue, aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	nni_mtx_unlock(&sock->lk);
}